

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O3

void __thiscall
pstore::region::factory::append<pstore::file::file_handle,pstore::memory_mapper>
          (factory *this,shared_ptr<pstore::file::file_handle> *file,
          not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
          regions,uint64_t original_size,uint64_t new_size)

{
  uint64_t minimum_size;
  ulong __length;
  ulong uVar1;
  char *__file;
  region_builder<pstore::file::file_handle,_pstore::memory_mapper> builder;
  shared_ptr<pstore::file::file_handle> local_60;
  region_builder<pstore::file::file_handle,_pstore::memory_mapper> local_50;
  
  if (original_size <= new_size) {
    minimum_size = this->min_size_;
    local_60.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (file->super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_60.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (file->super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_60.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_60.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_60.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_60.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_60.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    region_builder<pstore::file::file_handle,_pstore::memory_mapper>::region_builder
              (&local_50,&local_60,this->full_size_,minimum_size);
    if (local_60.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    uVar1 = (new_size + minimum_size) - 1;
    __length = uVar1 % minimum_size;
    __file = (char *)(uVar1 - __length);
    pstore::file::file_handle::truncate
              ((file->super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,__file,__length);
    region_builder<pstore::file::file_handle,_pstore::memory_mapper>::append
              (&local_50,regions,original_size,(long)__file - original_size);
    if (local_50.file_.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.file_.
                 super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return;
  }
  assert_failed("new_size >= original_size",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                ,0x111);
}

Assistant:

void factory::append (std::shared_ptr<File> file,
                              gsl::not_null<std::vector<memory_mapper_ptr> *> regions,
                              std::uint64_t original_size, std::uint64_t new_size) {

            PSTORE_ASSERT (new_size >= original_size);

            auto const min_size = this->min_size ();
            region_builder<File, MemoryMapper> builder (file, this->full_size (), min_size);

            new_size = round_up (new_size, min_size);
            if (!small_files_enabled ()) {
                file->truncate (new_size);
            }
            builder.append (regions, original_size, new_size - original_size);
        }